

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_fft.hpp
# Opt level: O3

void __thiscall
re::fft::simd_fft<float,_256L>::stage_2n
          (simd_fft<float,_256L> *this,span<std::complex<float>,_256L> out,int_t stage)

{
  byte bVar1;
  long lVar2;
  int i;
  long lVar3;
  long lVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  _ComplexT local_e0;
  _ComplexT local_d8;
  pointer local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  simd_fft<float,_256L> *local_b0;
  ulong local_a8;
  long local_a0;
  _ComplexT local_98;
  undefined8 uStack_90;
  _ComplexT local_88;
  undefined8 uStack_80;
  _ComplexT local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  _ComplexT local_48;
  undefined8 uStack_40;
  
  if ((int)stage != 0x1f) {
    bVar1 = (byte)stage;
    local_b8 = (ulong)(uint)(1 << (bVar1 & 0x1f));
    local_a0 = (long)(4 << (bVar1 & 0x1f));
    lVar2 = (long)out.storage_.data_ + local_b8 * 8;
    lVar5 = (long)out.storage_.data_ + (long)(2 << (bVar1 & 0x1f)) * 8;
    lVar4 = (long)out.storage_.data_ + (long)(3 << (bVar1 & 0x1f)) * 8;
    local_a8 = 0;
    local_b0 = this;
    do {
      local_e0 = (local_b0->w_twiddles)._M_elems[local_a8]._M_value;
      uStack_90 = 0;
      local_d8 = local_e0;
      local_d0 = (pointer)out.storage_.data_;
      local_98 = local_e0;
      std::
      transform<std::complex<float>const*,std::complex<float>const*,std::complex<float>*,re::simd::intrinsics::mul<std::complex<float>>>
                (&local_e0,&local_d8,&local_d8,&local_e0);
      local_78 = local_e0;
      uStack_70 = 0;
      local_d8 = local_e0;
      local_e0 = local_98;
      std::
      transform<std::complex<float>const*,std::complex<float>const*,std::complex<float>*,re::simd::intrinsics::mul<std::complex<float>>>
                (&local_e0,&local_d8,&local_d8,&local_e0);
      local_88 = local_e0;
      uStack_80 = 0;
      lVar3 = 0;
      do {
        local_58 = local_d0[lVar3]._M_value;
        uStack_50 = 0;
        local_e0 = *(_ComplexT *)(lVar2 + lVar3 * 8);
        local_c8 = *(_ComplexT *)(lVar5 + lVar3 * 8);
        uStack_c0 = 0;
        local_48 = *(_ComplexT *)(lVar4 + lVar3 * 8);
        uStack_40 = 0;
        local_d8 = local_98;
        std::
        transform<std::complex<float>const*,std::complex<float>const*,std::complex<float>*,re::simd::intrinsics::mul<std::complex<float>>>
                  (&local_e0,&local_d8,&local_d8,&local_e0);
        local_68 = local_e0;
        uStack_60 = 0;
        local_e0 = local_c8;
        local_d8 = local_78;
        std::
        transform<std::complex<float>const*,std::complex<float>const*,std::complex<float>*,re::simd::intrinsics::mul<std::complex<float>>>
                  (&local_e0,&local_d8,&local_d8,&local_e0);
        local_c8 = local_e0;
        uStack_c0 = 0;
        local_e0 = local_48;
        local_d8 = local_88;
        std::
        transform<std::complex<float>const*,std::complex<float>const*,std::complex<float>*,re::simd::intrinsics::mul<std::complex<float>>>
                  (&local_e0,&local_d8,&local_d8,&local_e0);
        fVar9 = (float)(local_e0 >> 0x20);
        fVar6 = (float)local_c8 - (float)local_e0;
        fVar7 = local_c8._4_4_ - fVar9;
        fVar8 = (float)local_c8 + (float)local_e0;
        fVar9 = local_c8._4_4_ + fVar9;
        local_d0[lVar3]._M_value =
             CONCAT44(local_58._4_4_ + local_68._4_4_ + fVar9,
                      (float)local_58 + (float)local_68 + fVar8);
        *(ulong *)(lVar2 + lVar3 * 8) =
             CONCAT44((local_58._4_4_ - local_68._4_4_) + fVar7,
                      ((float)local_58 - (float)local_68) + fVar6);
        *(ulong *)(lVar5 + lVar3 * 8) =
             CONCAT44((local_58._4_4_ + local_68._4_4_) - fVar9,
                      ((float)local_58 + (float)local_68) - fVar8);
        *(ulong *)(lVar4 + lVar3 * 8) =
             CONCAT44((local_58._4_4_ - local_68._4_4_) - fVar7,
                      ((float)local_58 - (float)local_68) - fVar6);
        lVar3 = lVar3 + local_a0;
      } while (lVar3 < 0x100);
      local_a8 = local_a8 + 1;
      lVar4 = lVar4 + 8;
      lVar5 = lVar5 + 8;
      lVar2 = lVar2 + 8;
      out.storage_.data_ = (storage_type<gsl::details::extent_type<256L>_>)(local_d0 + 1);
    } while (local_a8 != local_b8);
  }
  return;
}

Assistant:

void stage_2n(gsl::span<cpx_t, N> out, int_t stage) const noexcept {
        auto const stride = 1 << stage;

        for (auto j = 0; j < stride; j += simd::width<cpx_t>) {
            auto w1 = simd::load(&w_twiddles[j]);
            auto w2 = simd::intrinsics::mul<cpx_t>()(w1, w1);
            auto w3 = simd::intrinsics::mul<cpx_t>()(w1, w2);

            for (auto i = 0; i < N; i += 4*stride) {
                auto x_a = simd::load(&out[j + i + 0 * stride]);
                auto x_b = simd::load(&out[j + i + 1 * stride]);
                auto x_c = simd::load(&out[j + i + 2 * stride]);
                auto x_d = simd::load(&out[j + i + 3 * stride]);

                auto w_x_b = simd::intrinsics::mul<cpx_t>()(x_b, w1);
                auto w_x_c = simd::intrinsics::mul<cpx_t>()(x_c, w2);
                auto w_x_d = simd::intrinsics::mul<cpx_t>()(x_d, w3);

                x_d = simd::intrinsics::sub<cpx_t>()(w_x_c, w_x_d);
                x_c = simd::intrinsics::add<cpx_t>()(w_x_c, w_x_d);
                x_b = simd::intrinsics::sub<cpx_t>()(x_a, w_x_b);
                x_a = simd::intrinsics::add<cpx_t>()(x_a, w_x_b);

                w_x_d = x_d;
                x_d = simd::intrinsics::sub<cpx_t>()(x_b, w_x_d);
                x_b = simd::intrinsics::add<cpx_t>()(x_b, w_x_d);

                w_x_c = x_c;
                x_c = simd::intrinsics::sub<cpx_t>()(x_a, w_x_c);
                x_a = simd::intrinsics::add<cpx_t>()(x_a, w_x_c);

                simd::store(&out[j + i + 0 * stride], x_a);
                simd::store(&out[j + i + 1 * stride], x_b);
                simd::store(&out[j + i + 2 * stride], x_c);
                simd::store(&out[j + i + 3 * stride], x_d);
            }
        }
    }